

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t _elemsize;
  int *piVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Mat *pMVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  Option *opt_00;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  Allocator *local_88;
  int iStack_80;
  int iStack_7c;
  undefined8 uStack_78;
  int local_70;
  size_t local_68;
  Mat *local_40;
  Option *local_38;
  
  iVar15 = bottom_blob->w;
  iVar1 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  iVar2 = this->kernel_w;
  iVar3 = this->dilation_w;
  iVar4 = this->kernel_h;
  iVar5 = this->stride_w;
  iVar6 = this->dilation_h;
  iVar7 = this->stride_h;
  iVar8 = this->output_pad_right;
  iVar9 = this->output_pad_bottom;
  local_68 = 0;
  opt_00 = (Option *)0x0;
  uStack_a0 = 0;
  uStack_9c = 0;
  local_88 = (Allocator *)0x0;
  iStack_80 = 0;
  iStack_7c = 0;
  uStack_78._0_4_ = 0;
  uStack_78._4_4_ = 0;
  local_70 = 0;
  auVar17._0_4_ = -(uint)(0 < this->pad_left);
  auVar17._4_4_ = -(uint)(0 < this->pad_right);
  auVar17._8_4_ = -(uint)(0 < this->pad_top);
  auVar17._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar14 = movmskps((int)&iStack_80,auVar17);
  lVar16 = 0x10;
  if ((iVar14 == 0) &&
     (((this->output_w < 1 || (this->output_h < 1)) &&
      (lVar16 = 8, (Mat *)&stack0xffffffffffffff58 != top_blob)))) {
    piVar10 = top_blob->refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    lVar16 = 8;
    opt_00 = (Option *)top_blob->data;
    uStack_a0 = SUB84(top_blob->refcount,0);
    uStack_9c = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_88 = top_blob->allocator;
    uVar11 = top_blob->dims;
    uVar12 = top_blob->w;
    uStack_78._0_4_ = top_blob->h;
    uStack_78._4_4_ = top_blob->d;
    local_70 = top_blob->c;
    local_68 = top_blob->cstep;
    iStack_80 = uVar11;
    iStack_7c = uVar12;
  }
  local_40 = top_blob;
  local_38 = opt;
  Mat::create((Mat *)&stack0xffffffffffffff58,
              iVar8 + (iVar2 + -1) * iVar3 + (iVar15 + -1) * iVar5 + 1,
              iVar9 + 1 + (iVar4 + -1) * iVar6 + (iVar1 + -1) * iVar7,this->num_output,_elemsize,
              *(Allocator **)(&opt->lightmode + lVar16));
  iVar15 = -100;
  if ((opt_00 != (Option *)0x0) && ((long)local_70 * local_68 != 0)) {
    deconvolution(bottom_blob,(Mat *)&stack0xffffffffffffff58,&this->weight_data,&this->bias_data,
                  this->kernel_w,this->kernel_h,this->stride_w,this->stride_h,this->dilation_w,
                  this->dilation_h,this->activation_type,&this->activation_params,opt_00);
    pMVar13 = local_40;
    cut_padding(this,(Mat *)&stack0xffffffffffffff58,local_40,local_38);
    if ((pMVar13->data != (void *)0x0) && (iVar15 = -100, (long)pMVar13->c * pMVar13->cstep != 0)) {
      iVar15 = 0;
    }
  }
  piVar10 = (int *)CONCAT44(uStack_9c,uStack_a0);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_88 == (Allocator *)0x0) {
        if (opt_00 != (Option *)0x0) {
          free(opt_00);
        }
      }
      else {
        (*local_88->_vptr_Allocator[3])();
      }
    }
  }
  return iVar15;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}